

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_binder.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::CheckBinder::BindCheckColumn
          (BindResult *__return_storage_ptr__,CheckBinder *this,ColumnRefExpression *colref)

{
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> *this_00;
  ColumnList *pCVar1;
  _Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var2;
  pointer pcVar3;
  bool bVar4;
  reference this_01;
  NotImplementedException *this_02;
  reference pvVar5;
  ColumnDefinition *this_03;
  ParsedExpression *pPVar6;
  LogicalType *other;
  storage_t *psVar7;
  BoundReferenceExpression *this_04;
  BinderException *this_05;
  __hashtable *__h;
  BindResult *this_06;
  size_type __n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_07;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  bound_expression;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_88;
  string local_80;
  BindResult *local_60;
  idx_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_60 = __return_storage_ptr__;
  bVar4 = ColumnRefExpression::IsQualified(colref);
  if ((!bVar4) &&
     ((this->super_ExpressionBinder).lambda_bindings.ptr !=
      (vector<duckdb::DummyBinding,_true> *)0x0)) {
    this_00 = &(this->super_ExpressionBinder).lambda_bindings;
    optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true>::CheckValid(this_00);
    __n = ((long)(this_00->ptr->
                 super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                 super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this_00->ptr->
                 super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                 super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * 0xf83e0f83e0f83e1;
    while (__n = __n - 1, __n != 0xffffffffffffffff) {
      optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true>::CheckValid(this_00);
      this_01 = vector<duckdb::DummyBinding,_true>::operator[](this_00->ptr,__n);
      (*(colref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
                (&local_80,colref);
      bVar4 = Binding::HasMatchingBinding(&this_01->super_Binding,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if (bVar4) {
        this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,
                   "Lambda functions are currently not supported in CHECK constraints.","");
        NotImplementedException::NotImplementedException(this_02,&local_80);
        __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
    }
  }
  this_06 = local_60;
  if ((ulong)((long)(colref->column_names).
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(colref->column_names).
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    this_07 = &colref->column_names;
    pCVar1 = this->columns;
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](this_07,0);
    bVar4 = ColumnList::ColumnExists(pCVar1,pvVar5);
    this_06 = local_60;
    if (!bVar4) {
      this_05 = (BinderException *)__cxa_allocate_exception(0x10);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,
                 "Table does not contain column %s referenced in check constraint!","");
      pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](this_07,0);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar3 = (pvVar5->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar3,pcVar3 + pvVar5->_M_string_length);
      BinderException::BinderException<std::__cxx11::string>(this_05,&local_80,&local_50);
      __cxa_throw(this_05,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar1 = this->columns;
    pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](this_07,0);
    this_03 = ColumnList::GetColumn(pCVar1,pvVar5);
    bVar4 = ColumnDefinition::Generated(this_03);
    if (bVar4) {
      pPVar6 = ColumnDefinition::GeneratedExpression(this_03);
      (*(pPVar6->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_80,pPVar6);
      (*(this->super_ExpressionBinder)._vptr_ExpressionBinder[5])(this_06,this,&local_80,0,0);
      if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
    }
    else {
      p_Var2 = (_Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this->bound_columns;
      local_58 = (idx_t)ColumnDefinition::Physical(this_03);
      local_80._M_dataplus._M_p = (pointer)p_Var2;
      ::std::
      _Hashtable<duckdb::PhysicalIndex,duckdb::PhysicalIndex,std::allocator<duckdb::PhysicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::PhysicalIndex>,duckdb::PhysicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<duckdb::PhysicalIndex,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::PhysicalIndex,true>>>>
                (p_Var2);
      other = ColumnDefinition::Type(this_03);
      psVar7 = ColumnDefinition::StorageOid(this_03);
      this_04 = (BoundReferenceExpression *)operator_new(0x60);
      LogicalType::LogicalType((LogicalType *)&local_80,other);
      BoundReferenceExpression::BoundReferenceExpression(this_04,(LogicalType *)&local_80,*psVar7);
      LogicalType::~LogicalType((LogicalType *)&local_80);
      local_88._M_head_impl = (Expression *)this_04;
      BindResult::BindResult
                (this_06,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&local_88);
      if ((BoundReferenceExpression *)local_88._M_head_impl != (BoundReferenceExpression *)0x0) {
        (*(((Expression *)&(local_88._M_head_impl)->super_BaseExpression)->super_BaseExpression).
          _vptr_BaseExpression[1])();
      }
    }
  }
  else {
    ExpressionBinder::BindQualifiedColumnName
              (local_60,&this->super_ExpressionBinder,colref,&this->table);
  }
  return this_06;
}

Assistant:

BindResult CheckBinder::BindCheckColumn(ColumnRefExpression &colref) {

	if (!colref.IsQualified()) {
		if (lambda_bindings) {
			for (idx_t i = lambda_bindings->size(); i > 0; i--) {
				if ((*lambda_bindings)[i - 1].HasMatchingBinding(colref.GetName())) {
					// FIXME: support lambdas in CHECK constraints
					// FIXME: like so: return (*lambda_bindings)[i - 1].Bind(colref, i, depth);
					// FIXME: and move this to LambdaRefExpression::FindMatchingBinding
					throw NotImplementedException("Lambda functions are currently not supported in CHECK constraints.");
				}
			}
		}
	}

	if (colref.column_names.size() > 1) {
		return BindQualifiedColumnName(colref, table);
	}
	if (!columns.ColumnExists(colref.column_names[0])) {
		throw BinderException("Table does not contain column %s referenced in check constraint!",
		                      colref.column_names[0]);
	}
	auto &col = columns.GetColumn(colref.column_names[0]);
	if (col.Generated()) {
		auto bound_expression = col.GeneratedExpression().Copy();
		return BindExpression(bound_expression, 0, false);
	}
	bound_columns.insert(col.Physical());
	D_ASSERT(col.StorageOid() != DConstants::INVALID_INDEX);
	return BindResult(make_uniq<BoundReferenceExpression>(col.Type(), col.StorageOid()));
}